

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::FinishPartialCollect(Recycler *this,RecyclerSweepManager *recyclerSweepManager)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (recyclerSweepManager != (RecyclerSweepManager *)0x0) {
    bVar2 = RecyclerSweepManager::IsBackground(recyclerSweepManager);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x10ac,
                         "(recyclerSweepManager == nullptr || !recyclerSweepManager->IsBackground())"
                         ,"recyclerSweepManager == nullptr || !recyclerSweepManager->IsBackground()"
                        );
      if (!bVar2) goto LAB_0067fa8e;
      *puVar3 = 0;
    }
  }
  if (this->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x10ae,"(inPartialCollectMode)","inPartialCollectMode");
    if (!bVar2) goto LAB_0067fa8e;
    *puVar3 = 0;
  }
  bVar2 = DoQueueTrackedObject(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x10b0,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar2) {
LAB_0067fa8e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  HeapInfoManager::FinishPartialCollect(&this->autoHeap,recyclerSweepManager);
  this->inPartialCollectMode = false;
  ClearPartialCollect(this);
  return;
}

Assistant:

void
Recycler::FinishPartialCollect(RecyclerSweepManager * recyclerSweepManager)
{
    Assert(recyclerSweepManager == nullptr || !recyclerSweepManager->IsBackground());
    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::FinishPartialPhase);
    Assert(inPartialCollectMode);
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif

    autoHeap.FinishPartialCollect(recyclerSweepManager);
    this->inPartialCollectMode = false;
    ClearPartialCollect();
    RECYCLER_PROFILE_EXEC_END(this, Js::FinishPartialPhase);
}